

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char>_>
fmt::v8::detail::write<char,std::back_insert_iterator<fmt::v8::detail::buffer<char>>>
          (back_insert_iterator<fmt::v8::detail::buffer<char>_> out,char *value)

{
  size_t sVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar2;
  
  if (value != (char *)0x0) {
    sVar1 = strlen(value);
    bVar2 = copy_str_noinline<char,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char>>>
                      (value,value + sVar1,out);
    return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar2.container;
  }
  throw_format_error("string pointer is null");
}

Assistant:

FMT_CONSTEXPR_CHAR_TRAITS auto write(OutputIt out, const Char* value)
    -> OutputIt {
  if (!value) {
    throw_format_error("string pointer is null");
  } else {
    out = write(out, basic_string_view<Char>(value));
  }
  return out;
}